

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_qdxt1.cpp
# Opt level: O0

int __thiscall crnlib::qdxt1::init(qdxt1 *this,EVP_PKEY_CTX *ctx)

{
  long lVar1;
  byte bVar2;
  uint uVar3;
  bool bVar4;
  undefined1 uVar5;
  uint uVar6;
  crn_thread_id_t cVar7;
  clusterizer<crnlib::vec<6U,_float>_> *pcVar8;
  byte *pbVar9;
  float *pfVar10;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar11;
  undefined8 extraout_RAX;
  void *in_RCX;
  dxt_pixel_block *in_RDX;
  float fVar12;
  double dVar13;
  undefined1 auVar14 [16];
  uint selectors;
  dxt1_block dxt_blk;
  uint block_index_3;
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  selector_hash;
  uint cMaxEndpointClusters;
  vec6F ev_1;
  uint weight_1;
  uint cMaxWeight_1;
  uint cColorDistToWeight_1;
  uint dist_1;
  color_quad_u8 h_1;
  color_quad_u8 l_2;
  uint block_index_2;
  uint block_index_1;
  uint block_x;
  uint x_3;
  uint block_y;
  uint y_3;
  vec6F ev;
  uint weight;
  uint cMaxWeight;
  uint cColorDistToWeight;
  uint dist;
  color_quad_u8 h;
  color_quad_u8 l_1;
  uint pix_x_1;
  uint x_2;
  uint pix_y_1;
  uint y_2;
  color_quad_u8 tile_pixels [64];
  color_quad_u8 c_1 [4];
  layout_results *layout;
  uint layout_index;
  chunk_tile_desc *tile_desc;
  uint t_1;
  chunk_encoding_desc *encoding_desc;
  float color_derating;
  double peak_snr;
  double root_mean_squared;
  double mean_squared;
  uint t;
  double total_error;
  chunk_encoding_desc *encoding_desc_1;
  uint e;
  uint best_encoding;
  double best_peak_snr;
  uint i;
  uint64 error;
  color_quad_u8 c [4];
  uint n_1;
  uint x_1;
  uint y_1;
  color_quad_u8 layout_pixels [64];
  uint y_ofs;
  uint x_ofs;
  uint height;
  uint width;
  uint l;
  layout_results layouts [9];
  color_quad_u8 *p;
  dxt_pixel_block *block;
  uint block_index;
  uint pix_x;
  uint x;
  uint outer_block_index;
  uint pix_y;
  uint y;
  color_quad_u8 chunk_pixels [64];
  uint chunk_x;
  uint chunk_y;
  float adaptive_tile_color_psnr_derating;
  uint level_height;
  uint level_width;
  uint num_chunks_y;
  uint num_chunks_x;
  mip_desc *level_desc;
  uint level;
  uint next_progress_threshold;
  uint total_processed_blocks;
  uint encoding_hist [8];
  training_vec_array *training_vecs;
  image_u8 debug_img;
  bool debugging;
  undefined4 in_stack_fffffffffffff578;
  uint in_stack_fffffffffffff57c;
  undefined2 in_stack_fffffffffffff580;
  undefined1 in_stack_fffffffffffff582;
  undefined1 in_stack_fffffffffffff583;
  float in_stack_fffffffffffff584;
  empty_type *in_stack_fffffffffffff588;
  vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *in_stack_fffffffffffff590;
  undefined4 in_stack_fffffffffffff598;
  float in_stack_fffffffffffff59c;
  clusterizer<crnlib::vec<6U,_float>_> *in_stack_fffffffffffff5a0;
  color_quad_u8 *in_stack_fffffffffffff5a8;
  uint in_stack_fffffffffffff5b4;
  float in_stack_fffffffffffff6ac;
  float *in_stack_fffffffffffff6b0;
  progress_callback_func_ptr in_stack_fffffffffffff6b8;
  uint in_stack_fffffffffffff6c4;
  clusterizer<crnlib::vec<6U,_float>_> *in_stack_fffffffffffff6c8;
  clusterizer<crnlib::vec<6U,_float>_> *local_928;
  color_quad_u8 *in_stack_fffffffffffff6e8;
  color_quad_u8 *hi;
  color_quad_u8 *in_stack_fffffffffffff6f0;
  color_quad<unsigned_char,_int> *this_00;
  undefined4 in_stack_fffffffffffff6f8;
  float in_stack_fffffffffffff6fc;
  double in_stack_fffffffffffff700;
  color_quad<unsigned_char,_int> *local_8e0;
  color_quad<unsigned_char,_int> *local_8c8;
  color_quad<unsigned_char,_int> *local_8a8;
  uint local_85c;
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  local_858;
  undefined4 local_838;
  vec<6U,_float> local_834;
  uint local_81c;
  undefined4 local_818;
  undefined4 local_814;
  uint local_810;
  color_quad<unsigned_char,_int> local_80c;
  color_quad<unsigned_char,_int> local_808;
  uint local_804;
  undefined4 local_800;
  uint local_7fc;
  uint local_7f8;
  uint local_7f4;
  uint local_7f0;
  uint local_7ec;
  vec<6U,_float> local_7e8;
  uint local_7d0;
  undefined4 local_7cc;
  undefined4 local_7c8;
  uint local_7c4;
  color_quad<unsigned_char,_int> local_7c0;
  color_quad<unsigned_char,_int> local_7bc;
  int local_7b8;
  float local_7b4;
  int local_7b0;
  float local_7ac;
  clusterizer<crnlib::vec<6U,_float>_> local_7a8 [2];
  undefined1 local_6a8 [16];
  vq_node *local_698;
  float local_68c;
  vec<6U,_float> *local_688;
  uint local_67c;
  uint *local_678;
  float local_66c;
  double local_668;
  double local_660;
  uint *local_658;
  uint local_64c;
  uint *local_648;
  uint *local_640;
  uint local_638;
  uint local_634;
  double local_630;
  uint local_624;
  long local_620;
  color_quad<unsigned_char,_int> local_618 [4];
  color_quad<unsigned_char,_int> cStack_608;
  uint local_604;
  uint local_600;
  uint local_5fc;
  color_quad<unsigned_char,_int> local_5f8 [64];
  color_quad<unsigned_char,_int> acStack_4f8 [3];
  int local_4ec;
  int local_4e8;
  uint local_4e4;
  uint local_4e0;
  uint local_4dc;
  vq_node local_4d8;
  long alStack_490 [82];
  color_quad<unsigned_char,_int> *local_200;
  dxt_pixel_block *local_1f8;
  uint local_1f0;
  uint local_1ec;
  uint local_1e8;
  int local_1e4;
  uint local_1e0;
  uint local_1dc;
  color_quad<unsigned_char,_int> local_1d8 [64];
  color_quad<unsigned_char,_int> acStack_d8 [3];
  uint local_cc;
  uint local_c8;
  float local_c4;
  int local_c0;
  int local_bc;
  uint local_b8;
  uint local_b4;
  mip_desc *local_b0;
  uint local_a4;
  uint local_a0;
  uint local_9c;
  int local_98 [12];
  training_vec_array *local_68;
  undefined1 local_29;
  void *local_28;
  dxt_pixel_block *local_20;
  uint local_14;
  qdxt1 *local_10;
  undefined1 local_1;
  
  local_14 = (uint)ctx;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_10 = this;
  clear((qdxt1 *)CONCAT44(in_stack_fffffffffffff584,
                          CONCAT13(in_stack_fffffffffffff583,
                                   CONCAT12(in_stack_fffffffffffff582,in_stack_fffffffffffff580))));
  cVar7 = crn_get_current_thread_id();
  this->m_main_thread_id = cVar7;
  this->m_num_blocks = local_14;
  this->m_pBlocks = local_20;
  memcpy(&this->m_params,local_28,0x630);
  clusterizer<crnlib::vec<6U,_float>_>::reserve_training_vecs
            ((clusterizer<crnlib::vec<6U,_float>_> *)
             CONCAT44(in_stack_fffffffffffff584,
                      CONCAT13(in_stack_fffffffffffff583,
                               CONCAT12(in_stack_fffffffffffff582,in_stack_fffffffffffff580))),
             in_stack_fffffffffffff57c);
  this->m_progress_start = 0;
  this->m_progress_range = 0x4b;
  local_29 = 0;
  image<crnlib::color_quad<unsigned_char,_int>_>::image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x178c3d);
  if ((((this->m_params).m_hierarchical & 1U) == 0) || ((this->m_params).m_num_mips == 0)) {
    for (local_804 = 0; uVar5 = (undefined1)((uint)in_stack_fffffffffffff6ac >> 0x18),
        local_804 < this->m_num_blocks; local_804 = local_804 + 1) {
      if (((local_804 & 0x1ff) == 0) &&
         (bVar4 = update_progress((qdxt1 *)CONCAT44(in_stack_fffffffffffff59c,
                                                    in_stack_fffffffffffff598),
                                  (uint)((ulong)in_stack_fffffffffffff590 >> 0x20),
                                  (uint)in_stack_fffffffffffff590), !bVar4)) {
        local_1 = 0;
        local_800 = 1;
        goto LAB_0017a395;
      }
      uVar5 = (undefined1)((ulong)in_stack_fffffffffffff588 >> 0x38);
      color_quad<unsigned_char,_int>::color_quad(&local_808);
      color_quad<unsigned_char,_int>::color_quad(&local_80c);
      dxt_fast::find_representative_colors
                ((uint)((ulong)in_stack_fffffffffffff700 >> 0x20),
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),
                 in_stack_fffffffffffff6f0,in_stack_fffffffffffff6e8);
      local_810 = crnlib::color::elucidian_distance
                            ((color_quad_u8 *)
                             CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                             (color_quad_u8 *)in_stack_fffffffffffff590,(bool)uVar5);
      local_814 = 5000;
      local_818 = 8;
      local_81c = math::clamp<unsigned_int>(local_810 / 5000,1,8);
      vec<6U,_float>::vec(&local_834);
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_808,0);
      bVar2 = *pbVar9;
      pfVar10 = vec<6U,_float>::operator[](&local_834,0);
      *pfVar10 = (float)bVar2;
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_808,1);
      bVar2 = *pbVar9;
      pfVar10 = vec<6U,_float>::operator[](&local_834,1);
      *pfVar10 = (float)bVar2;
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_808,2);
      bVar2 = *pbVar9;
      pfVar10 = vec<6U,_float>::operator[](&local_834,2);
      *pfVar10 = (float)bVar2;
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_80c,0);
      fVar12 = (float)*pbVar9;
      pfVar10 = vec<6U,_float>::operator[](&local_834,3);
      *pfVar10 = fVar12;
      pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_80c,1);
      in_stack_fffffffffffff59c = (float)*pbVar9;
      in_stack_fffffffffffff5a0 =
           (clusterizer<crnlib::vec<6U,_float>_> *)vec<6U,_float>::operator[](&local_834,4);
      *(float *)&(in_stack_fffffffffffff5a0->m_training_vecs).m_p = in_stack_fffffffffffff59c;
      in_stack_fffffffffffff590 =
           (vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_> *)
           color_quad<unsigned_char,_int>::operator[](&local_80c,2);
      in_stack_fffffffffffff584 = (float)*(byte *)&in_stack_fffffffffffff590->m_p;
      in_stack_fffffffffffff588 = (empty_type *)vec<6U,_float>::operator[](&local_834,5);
      *(float *)in_stack_fffffffffffff588 = in_stack_fffffffffffff584;
      clusterizer<crnlib::vec<6U,_float>_>::add_training_vec
                (in_stack_fffffffffffff5a0,
                 (vec<6U,_float> *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                 (uint)((ulong)in_stack_fffffffffffff590 >> 0x20));
    }
  }
  else {
    local_68 = clusterizer<crnlib::vec<6U,_float>_>::get_training_vecs
                         (&this->m_endpoint_clusterizer);
    vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::resize
              (in_stack_fffffffffffff590,(uint)((ulong)in_stack_fffffffffffff588 >> 0x20),
               SUB81((ulong)in_stack_fffffffffffff588 >> 0x18,0));
    utils::zero_object<unsigned_int[8]>((uint (*) [8])0x178cb8);
    local_9c = 0;
    local_a0 = 0x200;
    for (local_a4 = 0; uVar5 = (undefined1)((uint)in_stack_fffffffffffff6ac >> 0x18),
        local_a4 < (this->m_params).m_num_mips; local_a4 = local_a4 + 1) {
      local_b0 = (this->m_params).m_mip_desc + local_a4;
      local_b4 = local_b0->m_block_width + 1 >> 1;
      local_b8 = local_b0->m_block_height + 1 >> 1;
      local_bc = local_b0->m_block_width << 2;
      local_c0 = local_b0->m_block_height << 2;
      local_c4 = 1.5;
      local_928 = in_stack_fffffffffffff6c8;
      if (local_a4 != 0) {
        fVar12 = powf(3.1,(float)local_a4);
        local_c4 = math::maximum<float>(0.25,1.5 / fVar12);
        local_928 = in_stack_fffffffffffff6c8;
      }
      for (local_c8 = 0; local_c8 < local_b8; local_c8 = local_c8 + 1) {
        for (local_cc = 0; local_cc < local_b4; local_cc = local_cc + 1) {
          local_8a8 = local_1d8;
          do {
            color_quad<unsigned_char,_int>::color_quad(local_8a8);
            local_8a8 = local_8a8 + 1;
          } while (local_8a8 != acStack_d8);
          for (local_1dc = 0; local_1dc < 8; local_1dc = local_1dc + 1) {
            local_1e0 = math::minimum<unsigned_int>(local_1dc + local_c8 * 8,local_c0 - 1);
            local_1e4 = local_b0->m_first_block + (local_1e0 >> 2) * local_b0->m_block_width;
            for (local_1e8 = 0; local_1e8 < 8; local_1e8 = local_1e8 + 1) {
              local_1ec = math::minimum<unsigned_int>(local_1e8 + local_cc * 8,local_bc - 1);
              local_1f0 = local_1e4 + (local_1ec >> 2);
              local_1f8 = this->m_pBlocks + local_1f0;
              local_200 = (color_quad<unsigned_char,_int> *)
                          ((long)&local_1f8->m_pixels[0][local_1ec & 3].field_0 +
                          (ulong)((local_1e0 & 3) << 4));
              color_quad<unsigned_char,_int>::operator=
                        (local_1d8 + (local_1e8 + local_1dc * 8),local_200);
            }
          }
          for (local_4dc = 0; local_4dc < 9; local_4dc = local_4dc + 1) {
            local_4e0 = *(uint *)(g_chunk_tile_layouts + (ulong)local_4dc * 0x14 + 8);
            local_4e4 = *(uint *)(g_chunk_tile_layouts + (ulong)local_4dc * 0x14 + 0xc);
            local_4e8 = *(int *)(g_chunk_tile_layouts + (ulong)local_4dc * 0x14);
            local_4ec = *(int *)(g_chunk_tile_layouts + (ulong)local_4dc * 0x14 + 4);
            local_8c8 = local_5f8;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_8c8);
              local_8c8 = local_8c8 + 1;
            } while (local_8c8 != acStack_4f8);
            for (local_5fc = 0; local_5fc < local_4e4; local_5fc = local_5fc + 1) {
              for (local_600 = 0; local_600 < local_4e0; local_600 = local_600 + 1) {
                color_quad<unsigned_char,_int>::operator=
                          (local_5f8 + (local_600 + local_5fc * local_4e0),
                           local_1d8 + (local_4e8 + local_600 + (local_4ec + local_5fc) * 8));
              }
            }
            local_604 = local_4e0 * local_4e4;
            dxt_fast::compress_color_block
                      (in_stack_fffffffffffff5b4,in_stack_fffffffffffff5a8,
                       (uint *)in_stack_fffffffffffff5a0,
                       (uint *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                       (uint8 *)in_stack_fffffffffffff590,
                       SUB81((ulong)in_stack_fffffffffffff588 >> 0x38,0));
            local_8e0 = local_618;
            do {
              color_quad<unsigned_char,_int>::color_quad(local_8e0);
              local_8e0 = local_8e0 + 1;
            } while (local_8e0 != &cStack_608);
            dxt1_block::get_block_colors
                      ((color_quad_u8 *)
                       CONCAT44(in_stack_fffffffffffff57c,in_stack_fffffffffffff578),0,0);
            local_620 = 0;
            for (local_624 = 0; local_624 < local_604; local_624 = local_624 + 1) {
              uVar6 = crnlib::color::elucidian_distance
                                ((color_quad_u8 *)
                                 CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                                 (color_quad_u8 *)in_stack_fffffffffffff590,
                                 SUB81((ulong)in_stack_fffffffffffff588 >> 0x38,0));
              local_620 = (ulong)uVar6 + local_620;
            }
            alStack_490[(ulong)local_4dc * 10] = local_620;
          }
          local_630 = -1.0;
          local_634 = 0;
          for (local_638 = 0; local_638 < 8; local_638 = local_638 + 1) {
            local_640 = (uint *)(g_chunk_encodings + (ulong)local_638 * 0x54);
            local_648 = (uint *)0x0;
            for (local_64c = 0; local_64c < *local_640; local_64c = local_64c + 1) {
              lVar1 = alStack_490
                      [(ulong)*(uint *)((ulong)local_638 * 0x54 + 0x2830c4 + (ulong)local_64c * 0x14
                                       ) * 10];
              auVar14._8_4_ = (int)((ulong)lVar1 >> 0x20);
              auVar14._0_8_ = lVar1;
              auVar14._12_4_ = 0x45300000;
              local_648 = (uint *)((auVar14._8_8_ - 1.9342813113834067e+25) +
                                   ((double)CONCAT44(0x43300000,(int)lVar1) - 4503599627370496.0) +
                                  (double)local_648);
            }
            local_658 = (uint *)((double)local_648 * 0.0052083334885537624);
            local_660 = sqrt((double)local_658);
            local_668 = 999999.0;
            if (((double)local_658 != 0.0) || (NAN((double)local_658))) {
              dVar13 = log10(255.0 / local_660);
              in_stack_fffffffffffff700 = math::clamp<double>(dVar13 * 20.0,0.0,500.0);
              local_668 = in_stack_fffffffffffff700;
            }
            in_stack_fffffffffffff6fc =
                 math::lerp<float,float>
                           (0.0,local_c4,
                            (float)(*(int *)(g_chunk_encodings + (ulong)local_638 * 0x54) - 1) / 3.0
                           );
            local_668 = local_668 - (double)in_stack_fffffffffffff6fc;
            if (local_630 < local_668) {
              local_634 = local_638;
              local_630 = local_668;
            }
            local_66c = in_stack_fffffffffffff6fc;
          }
          local_98[local_634] = local_98[local_634] + 1;
          local_678 = (uint *)(g_chunk_encodings + (ulong)local_634 * 0x54);
          for (local_67c = 0; local_67c < *local_678; local_67c = local_67c + 1) {
            local_688 = (vec<6U,_float> *)(local_678 + (ulong)local_67c * 5 + 1);
            local_68c = local_688->m_s[4];
            local_698 = (vq_node *)((long)&local_4d8 + (ulong)(uint)local_68c * 0x50);
            this_00 = (color_quad<unsigned_char,_int> *)local_6a8;
            hi = (color_quad_u8 *)&local_698;
            do {
              color_quad<unsigned_char,_int>::color_quad(this_00);
              this_00 = this_00 + 1;
            } while (this_00 != hi);
            pcVar8 = local_7a8;
            do {
              local_928 = pcVar8;
              color_quad<unsigned_char,_int>::color_quad
                        ((color_quad<unsigned_char,_int> *)local_928);
              pcVar8 = (clusterizer<crnlib::vec<6U,_float>_> *)
                       ((long)&(local_928->m_training_vecs).m_p + 4);
            } while (pcVar8 != (clusterizer<crnlib::vec<6U,_float>_> *)local_6a8);
            for (local_7ac = 0.0; (uint)local_7ac < (uint)local_688->m_s[3];
                local_7ac = (float)((int)local_7ac + 1)) {
              local_7b0 = (int)local_7ac + (int)local_688->m_s[1];
              for (local_7b4 = 0.0; (uint)local_7b4 < (uint)local_688->m_s[2];
                  local_7b4 = (float)((int)local_7b4 + 1)) {
                local_7b8 = (int)local_7b4 + (int)local_688->m_s[0];
                color_quad<unsigned_char,_int>::operator=
                          ((color_quad<unsigned_char,_int> *)
                           ((long)&local_7a8[0].m_training_vecs.m_p +
                           (ulong)(uint)((int)local_7b4 + (int)local_7ac * (int)local_688->m_s[2]) *
                           4),local_1d8 + (uint)(local_7b8 + local_7b0 * 8));
              }
            }
            color_quad<unsigned_char,_int>::color_quad(&local_7bc);
            color_quad<unsigned_char,_int>::color_quad(&local_7c0);
            dxt_fast::find_representative_colors
                      ((uint)((ulong)in_stack_fffffffffffff700 >> 0x20),
                       (color_quad_u8 *)
                       CONCAT44(in_stack_fffffffffffff6fc,in_stack_fffffffffffff6f8),this_00,hi);
            in_stack_fffffffffffff6c4 =
                 crnlib::color::elucidian_distance
                           ((color_quad_u8 *)
                            CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                            (color_quad_u8 *)in_stack_fffffffffffff590,
                            SUB81((ulong)in_stack_fffffffffffff588 >> 0x38,0));
            local_7c8 = 5000;
            local_7cc = 8;
            local_7c4 = in_stack_fffffffffffff6c4;
            local_7d0 = math::clamp<unsigned_int>(in_stack_fffffffffffff6c4 / 5000,1,8);
            vec<6U,_float>::vec(&local_7e8);
            in_stack_fffffffffffff6b8 =
                 (progress_callback_func_ptr)
                 color_quad<unsigned_char,_int>::operator[](&local_7bc,0);
            in_stack_fffffffffffff6ac = (float)(byte)*in_stack_fffffffffffff6b8;
            in_stack_fffffffffffff6b0 = vec<6U,_float>::operator[](&local_7e8,0);
            *in_stack_fffffffffffff6b0 = in_stack_fffffffffffff6ac;
            pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_7bc,1);
            bVar2 = *pbVar9;
            pfVar10 = vec<6U,_float>::operator[](&local_7e8,1);
            *pfVar10 = (float)bVar2;
            pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_7bc,2);
            bVar2 = *pbVar9;
            pfVar10 = vec<6U,_float>::operator[](&local_7e8,2);
            *pfVar10 = (float)bVar2;
            pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_7c0,0);
            bVar2 = *pbVar9;
            pfVar10 = vec<6U,_float>::operator[](&local_7e8,3);
            *pfVar10 = (float)bVar2;
            pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_7c0,1);
            bVar2 = *pbVar9;
            pfVar10 = vec<6U,_float>::operator[](&local_7e8,4);
            *pfVar10 = (float)bVar2;
            pbVar9 = color_quad<unsigned_char,_int>::operator[](&local_7c0,2);
            bVar2 = *pbVar9;
            pfVar10 = vec<6U,_float>::operator[](&local_7e8,5);
            *pfVar10 = (float)bVar2;
            for (local_7ec = 0; local_7ec < (uint)local_688->m_s[3] >> 2; local_7ec = local_7ec + 1)
            {
              local_7f0 = local_c8 * 2 + local_7ec + ((uint)local_688->m_s[1] >> 2);
              if (local_7f0 < local_b0->m_block_height) {
                for (local_7f4 = 0;
                    (local_7f4 < (uint)local_688->m_s[2] >> 2 &&
                    (local_7f8 = local_cc * 2 + local_7f4 + ((uint)local_688->m_s[0] >> 2),
                    local_7f8 < local_b0->m_block_width)); local_7f4 = local_7f4 + 1) {
                  local_7fc = local_b0->m_first_block + local_7f8 +
                              local_7f0 * local_b0->m_block_width;
                  ppVar11 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                                      (local_68,local_7fc);
                  vec<6U,_float>::operator=(&ppVar11->first,&local_7e8);
                  uVar3 = local_7d0;
                  ppVar11 = vector<std::pair<crnlib::vec<6U,_float>,_unsigned_int>_>::operator[]
                                      (local_68,local_7fc);
                  ppVar11->second = uVar3;
                  local_9c = local_9c + 1;
                }
              }
            }
          }
          if (local_a0 <= local_9c) {
            local_a0 = local_a0 + 0x200;
            bVar4 = update_progress((qdxt1 *)CONCAT44(in_stack_fffffffffffff59c,
                                                      in_stack_fffffffffffff598),
                                    (uint)((ulong)in_stack_fffffffffffff590 >> 0x20),
                                    (uint)in_stack_fffffffffffff590);
            if (!bVar4) {
              local_1 = 0;
              local_800 = 1;
              goto LAB_0017a395;
            }
          }
        }
      }
      in_stack_fffffffffffff6c8 = local_928;
    }
  }
  local_838 = 0xffff;
  this->m_progress_start = 0x4b;
  this->m_progress_range = 0x14;
  uVar5 = clusterizer<crnlib::vec<6U,_float>_>::generate_codebook
                    (in_stack_fffffffffffff6c8,in_stack_fffffffffffff6c4,in_stack_fffffffffffff6b8,
                     in_stack_fffffffffffff6b0,(bool)uVar5);
  if ((bool)uVar5) {
    hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::hash_map((hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)CONCAT44(in_stack_fffffffffffff584,
                           CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffff582,
                                                   in_stack_fffffffffffff580))));
    this->m_progress_start = 0x5f;
    this->m_progress_range = 5;
    for (local_85c = 0; local_85c < this->m_num_blocks; local_85c = local_85c + 1) {
      if (((local_85c & 0x1ff) == 0) &&
         (in_stack_fffffffffffff582 =
               update_progress((qdxt1 *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598
                                                ),(uint)((ulong)in_stack_fffffffffffff590 >> 0x20),
                               (uint)in_stack_fffffffffffff590), !(bool)in_stack_fffffffffffff582))
      {
        local_1 = 0;
        goto LAB_0017a388;
      }
      dxt_fast::compress_color_block
                ((dxt1_block *)in_stack_fffffffffffff5a0,
                 (color_quad_u8 *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                 SUB81((ulong)in_stack_fffffffffffff590 >> 0x38,0));
      hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
      ::insert((hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
               (uint *)in_stack_fffffffffffff590,in_stack_fffffffffffff588);
    }
    uVar6 = hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
            ::size(&local_858);
    this->m_max_selector_clusters = uVar6 + 0x80;
    update_progress((qdxt1 *)CONCAT44(in_stack_fffffffffffff59c,in_stack_fffffffffffff598),
                    (uint)((ulong)in_stack_fffffffffffff590 >> 0x20),(uint)in_stack_fffffffffffff590
                   );
    local_1 = 1;
LAB_0017a388:
    local_800 = 1;
    hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
    ::~hash_map((hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
                 *)CONCAT44(in_stack_fffffffffffff584,
                            CONCAT13(uVar5,CONCAT12(in_stack_fffffffffffff582,
                                                    in_stack_fffffffffffff580))));
  }
  else {
    local_1 = 0;
    local_800 = 1;
  }
LAB_0017a395:
  image<crnlib::color_quad<unsigned_char,_int>_>::~image
            ((image<crnlib::color_quad<unsigned_char,_int>_> *)0x17a3a2);
  return (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),local_1) & 0xffffff01;
}

Assistant:

bool qdxt1::init(uint n, const dxt_pixel_block* pBlocks, const qdxt1_params& params) {
  clear();

  CRNLIB_ASSERT(n && pBlocks);

  m_main_thread_id = crn_get_current_thread_id();

  m_num_blocks = n;
  m_pBlocks = pBlocks;
  m_params = params;

  m_endpoint_clusterizer.reserve_training_vecs(m_num_blocks);

  m_progress_start = 0;
  m_progress_range = 75;

  const bool debugging = false;
  image_u8 debug_img;

  if ((m_params.m_hierarchical) && (m_params.m_num_mips)) {
    vec6F_clusterizer::training_vec_array& training_vecs = m_endpoint_clusterizer.get_training_vecs();
    training_vecs.resize(m_num_blocks);

    uint encoding_hist[cNumChunkEncodings];
    utils::zero_object(encoding_hist);

    uint total_processed_blocks = 0;
    uint next_progress_threshold = 512;

    for (uint level = 0; level < m_params.m_num_mips; level++) {
      const qdxt1_params::mip_desc& level_desc = m_params.m_mip_desc[level];

      const uint num_chunks_x = (level_desc.m_block_width + cChunkBlockWidth - 1) / cChunkBlockWidth;
      const uint num_chunks_y = (level_desc.m_block_height + cChunkBlockHeight - 1) / cChunkBlockHeight;

      const uint level_width = level_desc.m_block_width * 4;
      const uint level_height = level_desc.m_block_height * 4;

      if (debugging)
        debug_img.resize(num_chunks_x * cChunkPixelWidth, num_chunks_y * cChunkPixelHeight);

      float adaptive_tile_color_psnr_derating = 1.5f;  // was 2.4f
      if ((level) && (adaptive_tile_color_psnr_derating > .25f)) {
        adaptive_tile_color_psnr_derating = math::maximum(.25f, adaptive_tile_color_psnr_derating / powf(3.1f, static_cast<float>(level)));  // was 3.0f
      }
      for (uint chunk_y = 0; chunk_y < num_chunks_y; chunk_y++) {
        for (uint chunk_x = 0; chunk_x < num_chunks_x; chunk_x++) {
          color_quad_u8 chunk_pixels[cChunkPixelWidth * cChunkPixelHeight];

          for (uint y = 0; y < cChunkPixelHeight; y++) {
            const uint pix_y = math::minimum<uint>(chunk_y * cChunkPixelHeight + y, level_height - 1);

            const uint outer_block_index = level_desc.m_first_block + ((pix_y >> 2) * level_desc.m_block_width);

            for (uint x = 0; x < cChunkPixelWidth; x++) {
              const uint pix_x = math::minimum<uint>(chunk_x * cChunkPixelWidth + x, level_width - 1);

              const uint block_index = outer_block_index + (pix_x >> 2);

              const dxt_pixel_block& block = m_pBlocks[block_index];

              const color_quad_u8& p = block.m_pixels[pix_y & 3][pix_x & 3];

              chunk_pixels[x + y * 8] = p;
            }
          }

          struct layout_results {
            uint m_low_color;
            uint m_high_color;
            uint8 m_selectors[cChunkPixelWidth * cChunkPixelHeight];
            uint64 m_error;
            //float m_penalty;
          };
          layout_results layouts[cNumChunkTileLayouts];

          for (uint l = 0; l < cNumChunkTileLayouts; l++) {
            const uint width = g_chunk_tile_layouts[l].m_width;
            const uint height = g_chunk_tile_layouts[l].m_height;
            const uint x_ofs = g_chunk_tile_layouts[l].m_x_ofs;
            const uint y_ofs = g_chunk_tile_layouts[l].m_y_ofs;

            color_quad_u8 layout_pixels[cChunkPixelWidth * cChunkPixelHeight];
            for (uint y = 0; y < height; y++)
              for (uint x = 0; x < width; x++)
                layout_pixels[x + y * width] = chunk_pixels[(x_ofs + x) + (y_ofs + y) * cChunkPixelWidth];

            const uint n = width * height;
            dxt_fast::compress_color_block(n, layout_pixels, layouts[l].m_low_color, layouts[l].m_high_color, layouts[l].m_selectors);

            color_quad_u8 c[4];
            dxt1_block::get_block_colors(c, static_cast<uint16>(layouts[l].m_low_color), static_cast<uint16>(layouts[l].m_high_color));

            uint64 error = 0;
            for (uint i = 0; i < n; i++)
              error += color::elucidian_distance(layout_pixels[i], c[layouts[l].m_selectors[i]], false);

            layouts[l].m_error = error;

#if 0
                     if ((width > 4) || (height > 4))
                     {
                        const uint dist = color::elucidian_distance(
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_low_color), true),
                           dxt1_block::unpack_color(static_cast<uint16>(layouts[l].m_high_color), true), false);

                        layouts[l].m_penalty = math::clamp((sqrt((float)dist) - 75.0f) / 150.0f, 0.0f, 2.0f);
                        if ((width == 8) && (height == 8))
                           layouts[l].m_penalty *= 2.0f;
                     }
                     else
                     {
                        layouts[l].m_penalty = 0.0f;
                     }
#endif
          }

          double best_peak_snr = -1.0f;
          uint best_encoding = 0;

          for (uint e = 0; e < cNumChunkEncodings; e++) {
            const chunk_encoding_desc& encoding_desc = g_chunk_encodings[e];

            double total_error = 0;

            for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
              total_error += (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_error;

            //double mean_squared = total_error * (1.0f / (16.0f * 3.0f));
            double mean_squared = total_error * (1.0f / (64.0f * 3.0f));
            double root_mean_squared = sqrt(mean_squared);

            double peak_snr = 999999.0f;
            if (mean_squared)
              peak_snr = math::clamp<double>(log10(255.0f / root_mean_squared) * 20.0f, 0.0f, 500.0f);

            //if (level)
            //   adaptive_tile_color_psnr_derating = math::lerp(adaptive_tile_color_psnr_derating * .5f, .3f, math::maximum((level - 1) / float(m_params.m_num_mips - 2), 1.0f));

            float color_derating = math::lerp(0.0f, adaptive_tile_color_psnr_derating, (g_chunk_encodings[e].m_num_tiles - 1) / 3.0f);
            peak_snr = peak_snr - color_derating;

            //for (uint t = 0; t < encoding_desc.m_num_tiles; t++)
            //   peak_snr -= (double)layouts[encoding_desc.m_tiles[t].m_layout_index].m_penalty;

            if (peak_snr > best_peak_snr) {
              best_peak_snr = peak_snr;
              best_encoding = e;
            }
          }

          encoding_hist[best_encoding]++;

          const chunk_encoding_desc& encoding_desc = g_chunk_encodings[best_encoding];

          for (uint t = 0; t < encoding_desc.m_num_tiles; t++) {
            const chunk_tile_desc& tile_desc = encoding_desc.m_tiles[t];

            uint layout_index = tile_desc.m_layout_index;
            const layout_results& layout = layouts[layout_index];
            color_quad_u8 c[4];
            if (debugging)
              dxt1_block::get_block_colors(c, static_cast<uint16>(layout.m_low_color), static_cast<uint16>(layout.m_high_color));

            color_quad_u8 tile_pixels[cChunkPixelWidth * cChunkPixelHeight];

            for (uint y = 0; y < tile_desc.m_height; y++) {
              const uint pix_y = y + tile_desc.m_y_ofs;

              for (uint x = 0; x < tile_desc.m_width; x++) {
                const uint pix_x = x + tile_desc.m_x_ofs;

                tile_pixels[x + y * tile_desc.m_width] = chunk_pixels[pix_x + pix_y * cChunkPixelWidth];

                if (debugging)
                  debug_img(chunk_x * 8 + pix_x, chunk_y * 8 + pix_y) = c[layout.m_selectors[x + y * tile_desc.m_width]];
              }
            }

            color_quad_u8 l, h;
            dxt_fast::find_representative_colors(tile_desc.m_width * tile_desc.m_height, tile_pixels, l, h);

            //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
            const uint dist = color::elucidian_distance(l, h, false);

            const uint cColorDistToWeight = 5000;
            const uint cMaxWeight = 8;
            uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

            vec6F ev;

            ev[0] = l[0];
            ev[1] = l[1];
            ev[2] = l[2];
            ev[3] = h[0];
            ev[4] = h[1];
            ev[5] = h[2];

            for (uint y = 0; y < (tile_desc.m_height >> 2); y++) {
              uint block_y = chunk_y * cChunkBlockHeight + y + (tile_desc.m_y_ofs >> 2);
              if (block_y >= level_desc.m_block_height)
                continue;

              for (uint x = 0; x < (tile_desc.m_width >> 2); x++) {
                uint block_x = chunk_x * cChunkBlockWidth + x + (tile_desc.m_x_ofs >> 2);
                if (block_x >= level_desc.m_block_width)
                  break;

                uint block_index = level_desc.m_first_block + block_x + block_y * level_desc.m_block_width;

                training_vecs[block_index].first = ev;
                training_vecs[block_index].second = weight;

                total_processed_blocks++;

                //if (debugging)
                //{
                //   debug_img(block_x, block_y) = l;
                //   debug_img(block_x + level_desc.m_block_width, block_y) = h;
                //}

              }  // x
            }    // y
          }      //t

          if (total_processed_blocks >= next_progress_threshold) {
            next_progress_threshold += 512;

            if (!update_progress(total_processed_blocks, m_num_blocks - 1))
              return false;
          }

        }  // chunk_x
      }    // chunk_y

#if GENERATE_DEBUG_IMAGES
      if (debugging)
        image_utils::write_to_file(dynamic_string(cVarArg, "debug_%u.tga", level).get_ptr(), debug_img, image_utils::cWriteFlagIgnoreAlpha);
#endif

    }  // level

#if 0
         trace("chunk encoding hist: ");
         for (uint i = 0; i < cNumChunkEncodings; i++)
            trace("%u ", encoding_hist[i]);
         trace("\n");
#endif
  } else {
    for (uint block_index = 0; block_index < m_num_blocks; block_index++) {
      if ((block_index & 511) == 0) {
        if (!update_progress(block_index, m_num_blocks - 1))
          return false;
      }

      color_quad_u8 l, h;
      dxt_fast::find_representative_colors(cDXTBlockSize * cDXTBlockSize, &m_pBlocks[block_index].m_pixels[0][0], l, h);

      //const uint dist = color::color_distance(m_params.m_perceptual, l, h, false);
      const uint dist = color::elucidian_distance(l, h, false);

      const uint cColorDistToWeight = 5000;
      const uint cMaxWeight = 8;
      uint weight = math::clamp<uint>(dist / cColorDistToWeight, 1, cMaxWeight);

      vec6F ev;

      ev[0] = l[0];
      ev[1] = l[1];
      ev[2] = l[2];
      ev[3] = h[0];
      ev[4] = h[1];
      ev[5] = h[2];

      m_endpoint_clusterizer.add_training_vec(ev, weight);
    }
  }

  const uint cMaxEndpointClusters = 65535U;

  m_progress_start = 75;
  m_progress_range = 20;

  if (!m_endpoint_clusterizer.generate_codebook(cMaxEndpointClusters, generate_codebook_progress_callback, this))
    return false;

  crnlib::hash_map<uint, empty_type> selector_hash;

  m_progress_start = 95;
  m_progress_range = 5;

  for (uint block_index = 0; block_index < m_num_blocks; block_index++) {
    if ((block_index & 511) == 0) {
      if (!update_progress(block_index, m_num_blocks - 1))
        return false;
    }

    dxt1_block dxt_blk;
    dxt_fast::compress_color_block(&dxt_blk, &m_pBlocks[block_index].m_pixels[0][0]);

    uint selectors = dxt_blk.m_selectors[0] | (dxt_blk.m_selectors[1] << 8) | (dxt_blk.m_selectors[2] << 16) | (dxt_blk.m_selectors[3] << 24);

    selector_hash.insert(selectors);
  }

  m_max_selector_clusters = selector_hash.size() + 128;

  //      trace("max endpoint clusters: %u\n", m_endpoint_clusterizer.get_codebook_size());
  //      trace("max selector clusters: %u\n", m_max_selector_clusters);

  update_progress(1, 1);

  return true;
}